

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RandSequenceStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandSequenceStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,Token *args_5,SyntaxList<slang::syntax::ProductionSyntax> *args_6,
          Token *args_7)

{
  size_type sVar1;
  pointer ppPVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  TokenKind TVar20;
  undefined1 uVar21;
  NumericTokenFlags NVar22;
  uint32_t uVar23;
  SyntaxKind SVar24;
  undefined4 uVar25;
  TokenKind TVar26;
  undefined1 uVar27;
  NumericTokenFlags NVar28;
  uint32_t uVar29;
  long lVar30;
  RandSequenceStatementSyntax *this_00;
  
  this_00 = (RandSequenceStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RandSequenceStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (RandSequenceStatementSyntax *)allocateSlow(this,200,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar8 = args_2->kind;
  uVar9 = args_2->field_0x2;
  NVar10.raw = (args_2->numFlags).raw;
  uVar11 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar16 = args_4->kind;
  uVar17 = args_4->field_0x2;
  NVar18.raw = (args_4->numFlags).raw;
  uVar19 = args_4->rawLen;
  pIVar5 = args_4->info;
  TVar20 = args_5->kind;
  uVar21 = args_5->field_0x2;
  NVar22.raw = (args_5->numFlags).raw;
  uVar23 = args_5->rawLen;
  pIVar6 = args_5->info;
  TVar26 = args_7->kind;
  uVar27 = args_7->field_0x2;
  NVar28.raw = (args_7->numFlags).raw;
  uVar29 = args_7->rawLen;
  pIVar7 = args_7->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,RandSequenceStatement,*args,args_1);
  (this_00->randsequence).kind = TVar8;
  (this_00->randsequence).field_0x2 = uVar9;
  (this_00->randsequence).numFlags = (NumericTokenFlags)NVar10.raw;
  (this_00->randsequence).rawLen = uVar11;
  (this_00->randsequence).info = pIVar3;
  (this_00->openParen).kind = TVar12;
  (this_00->openParen).field_0x2 = uVar13;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (this_00->openParen).rawLen = uVar15;
  (this_00->openParen).info = pIVar4;
  (this_00->firstProduction).kind = TVar16;
  (this_00->firstProduction).field_0x2 = uVar17;
  (this_00->firstProduction).numFlags = (NumericTokenFlags)NVar18.raw;
  (this_00->firstProduction).rawLen = uVar19;
  (this_00->firstProduction).info = pIVar5;
  (this_00->closeParen).kind = TVar20;
  (this_00->closeParen).field_0x2 = uVar21;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar22.raw;
  (this_00->closeParen).rawLen = uVar23;
  (this_00->closeParen).info = pIVar6;
  SVar24 = (args_6->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar25 = *(undefined4 *)&(args_6->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this_00->productions).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_6->super_SyntaxListBase).super_SyntaxNode.parent;
  (this_00->productions).super_SyntaxListBase.super_SyntaxNode.kind = SVar24;
  *(undefined4 *)&(this_00->productions).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar25;
  (this_00->productions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this_00->productions).super_SyntaxListBase.childCount = (args_6->super_SyntaxListBase).childCount
  ;
  sVar1 = (args_6->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>).size_;
  (this_00->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.data_
       = (args_6->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>).data_;
  (this_00->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.size_
       = sVar1;
  (this_00->productions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004edae0;
  (this_00->endsequence).kind = TVar26;
  (this_00->endsequence).field_0x2 = uVar27;
  (this_00->endsequence).numFlags = (NumericTokenFlags)NVar28.raw;
  (this_00->endsequence).rawLen = uVar29;
  (this_00->endsequence).info = pIVar7;
  (this_00->productions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this_00;
  sVar1 = (this_00->productions).
          super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppPVar2 = (this_00->productions).
              super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.data_;
    lVar30 = 0;
    do {
      **(undefined8 **)((long)ppPVar2 + lVar30) = this_00;
      lVar30 = lVar30 + 8;
    } while (sVar1 << 3 != lVar30);
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }